

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_inter.c
# Opt level: O2

void sys_unqueuegui(void *client)

{
  t_guiqueue *fatso;
  t_guiqueue *ptVar1;
  
  while( true ) {
    fatso = (pd_maininstance.pd_inter)->i_guiqueuehead;
    if (fatso == (t_guiqueue *)0x0) {
      return;
    }
    if (fatso->gq_client != client) break;
    (pd_maininstance.pd_inter)->i_guiqueuehead = fatso->gq_next;
    freebytes(fatso,0x20);
  }
  do {
    ptVar1 = fatso;
    fatso = ptVar1->gq_next;
    if (fatso == (_guiqueue *)0x0) {
      return;
    }
  } while (fatso->gq_client != client);
  ptVar1->gq_next = fatso->gq_next;
  freebytes(fatso,0x20);
  return;
}

Assistant:

void sys_unqueuegui(void *client)
{
    t_guiqueue *gq, *gq2;
    while (INTER->i_guiqueuehead && INTER->i_guiqueuehead->gq_client == client)
    {
        gq = INTER->i_guiqueuehead;
        INTER->i_guiqueuehead = INTER->i_guiqueuehead->gq_next;
        t_freebytes(gq, sizeof(*gq));
    }
    if (!INTER->i_guiqueuehead)
        return;
    for (gq = INTER->i_guiqueuehead; (gq2 = gq->gq_next); gq = gq2)
        if (gq2->gq_client == client)
        {
            gq->gq_next = gq2->gq_next;
            t_freebytes(gq2, sizeof(*gq2));
            break;
        }
}